

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::TemplatedRadixScatter<signed_char>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t i;
  idx_t iVar7;
  undefined3 in_register_00000089;
  
  pdVar1 = vdata->data;
  if (CONCAT31(in_register_00000089,has_null) == 0) {
    for (uVar4 = 0; add_count != uVar4; uVar4 = uVar4 + 1) {
      uVar5 = uVar4;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar4];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar2[uVar5];
      }
      *key_locations[uVar4] = pdVar1[uVar5 + offset] + 0x80;
      if (desc) {
        *key_locations[uVar4] = ~*key_locations[uVar4];
      }
      key_locations[uVar4] = key_locations[uVar4] + 1;
    }
  }
  else {
    for (iVar7 = 0; add_count != iVar7; iVar7 = iVar7 + 1) {
      iVar6 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar7];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar6 = (idx_t)psVar2[iVar6];
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         iVar6 + offset);
      if (bVar3) {
        *key_locations[iVar7] = nulls_first;
        key_locations[iVar7][1] = pdVar1[iVar6 + offset] + 0x80;
        if (desc) {
          key_locations[iVar7][1] = ~key_locations[iVar7][1];
        }
      }
      else {
        *key_locations[iVar7] = !nulls_first;
        key_locations[iVar7][1] = '\0';
      }
      key_locations[iVar7] = key_locations[iVar7] + 2;
    }
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}